

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

bool RunCommand(char *comment,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *command,bool verbose,NumberFormat exitFormat,int *retCodeOut,
               _func_bool_int *retCodeOkay)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  ostream *this;
  _func_int *p_Var7;
  uint uVar8;
  uint uVar9;
  undefined7 in_register_00000011;
  string_view separator;
  string_view separator_00;
  int retCode;
  NumberFormat local_7c;
  string output;
  string local_50;
  
  local_7c = exitFormat;
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,comment);
    std::operator<<(poVar5,":\n");
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&output,command,separator,(string_view)ZEXT816(0));
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)&output);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&output);
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  retCode = 0;
  bVar2 = cmSystemTools::RunSingleCommand
                    (command,&output,&output,&retCode,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0,Auto);
  if (retCode == 0) {
    bVar3 = true;
  }
  else if (retCodeOkay == (_func_bool_int *)0x0) {
    bVar3 = false;
  }
  else {
    bVar3 = (*retCodeOkay)(retCode);
  }
  if (retCodeOut != (int *)0x0) {
    iVar4 = -1;
    if (bVar3 == false) {
      iVar4 = retCode;
    }
    if (bVar2) {
      iVar4 = retCode;
    }
    *retCodeOut = iVar4;
  }
  if ((bool)(bVar2 & bVar3) == false) {
    poVar5 = std::operator<<((ostream *)&std::cout,comment);
    poVar5 = std::operator<<(poVar5,": command \"");
    separator_00._M_str = " ";
    separator_00._M_len = 1;
    cmJoin(&local_50,command,separator_00,(string_view)ZEXT816(0));
    poVar5 = std::operator<<(poVar5,(string *)&local_50);
    poVar5 = std::operator<<(poVar5,"\" failed (exit code ");
    iVar4 = retCode;
    uVar1 = *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]);
    if (local_7c == FORMAT_DECIMAL) {
      p_Var7 = (_func_int *)
               ((long)&poVar5->_vptr_basic_ostream + (long)poVar5->_vptr_basic_ostream[-3]);
      uVar9 = 2;
      this = poVar5;
      uVar8 = uVar1;
    }
    else {
      this = std::operator<<(poVar5,"0x");
      p_Var7 = (_func_int *)((long)&this->_vptr_basic_ostream + (long)this->_vptr_basic_ostream[-3])
      ;
      uVar9 = 8;
      uVar8 = *(uint *)(&this->field_0x18 + (long)this->_vptr_basic_ostream[-3]);
    }
    *(uint *)(p_Var7 + 0x18) = uVar8 & 0xffffffb5 | uVar9;
    std::ostream::operator<<(this,iVar4);
    *(uint *)(&poVar5->field_0x18 + (long)poVar5->_vptr_basic_ostream[-3]) = uVar1;
    poVar5 = std::operator<<(poVar5,") with the following output:\n");
    std::operator<<(poVar5,(string *)&output);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else if (verbose) {
    lVar6 = std::__cxx11::string::find((char *)&output,0x583ed7);
    if (lVar6 == -1) {
      std::operator<<((ostream *)&std::cout,(string *)&output);
    }
  }
  std::__cxx11::string::~string((string *)&output);
  return (bool)(bVar2 & bVar3);
}

Assistant:

static bool RunCommand(const char* comment,
                       std::vector<std::string> const& command, bool verbose,
                       NumberFormat exitFormat, int* retCodeOut = nullptr,
                       bool (*retCodeOkay)(int) = nullptr)
{
  if (verbose) {
    std::cout << comment << ":\n";
    std::cout << cmJoin(command, " ") << "\n";
  }
  std::string output;
  int retCode = 0;
  bool commandResult = cmSystemTools::RunSingleCommand(
    command, &output, &output, &retCode, nullptr, cmSystemTools::OUTPUT_NONE);
  bool const retCodeSuccess =
    retCode == 0 || (retCodeOkay && retCodeOkay(retCode));
  bool const success = commandResult && retCodeSuccess;
  if (retCodeOut) {
    if (commandResult || !retCodeSuccess) {
      *retCodeOut = retCode;
    } else {
      *retCodeOut = -1;
    }
  }
  if (!success) {
    std::cout << comment << ": command \"" << cmJoin(command, " ")
              << "\" failed (exit code "
              << NumberFormatter(exitFormat, retCode)
              << ") with the following output:\n"
              << output;
  } else if (verbose) {
    // always print the output of the command, unless
    // it is the dumb rc command banner
    if (output.find("Resource Compiler Version") == std::string::npos) {
      std::cout << output;
    }
  }
  return success;
}